

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O0

bool __thiscall WorkerFlow::recv_stream(WorkerFlow *this)

{
  string *this_00;
  int *piVar1;
  char *__s;
  allocator<char> local_15;
  int local_14;
  WorkerFlow *pWStack_10;
  int size;
  WorkerFlow *this_local;
  
  pWStack_10 = this;
  local_14 = zmq_recv(this->m_stream_socket,this->m_buffer,this->m_buffsize,0);
  if (local_14 == -1) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    piVar1 = __errno_location();
    __s = strerror(*piVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,&local_15);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (this->m_cb != (Callback *)0x0) {
    (**(code **)(*(long *)this->m_cb + 8))(this->m_cb,this->m_buffer,(long)local_14);
  }
  return true;
}

Assistant:

bool WorkerFlow::recv_stream()
{
    // receive a workload into the worker buffer.
    int size = zmq_recv(m_stream_socket, m_buffer, m_buffsize, 0);
    if (size == -1) {
        throw std::string(strerror(errno));
    }

    // tell the callback that there's workload to take.
    if (m_cb) {
        m_cb->on_workload(m_buffer, size);
    }

    // Keep receiving
    return true;
}